

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall slang::driver::Driver::addStandardArgs(Driver *this)

{
  CommandLine *this_00;
  string_view valueName;
  string_view valueName_00;
  string_view valueName_01;
  string_view valueName_02;
  string_view valueName_03;
  string_view valueName_04;
  string_view valueName_05;
  string_view valueName_06;
  string_view valueName_07;
  string_view valueName_08;
  string_view valueName_09;
  string_view valueName_10;
  string_view valueName_11;
  string_view valueName_12;
  string_view valueName_13;
  string_view valueName_14;
  string_view valueName_15;
  string_view valueName_16;
  string_view valueName_17;
  string_view valueName_18;
  string_view valueName_19;
  string_view valueName_20;
  string_view valueName_21;
  string_view valueName_22;
  string_view valueName_23;
  string_view valueName_24;
  string_view valueName_25;
  string_view valueName_26;
  string_view valueName_27;
  string_view valueName_28;
  string_view valueName_29;
  string_view valueName_30;
  string_view valueName_31;
  string_view valueName_32;
  string_view valueName_33;
  string_view valueName_34;
  string_view valueName_35;
  string_view valueName_36;
  string_view valueName_37;
  string_view valueName_38;
  string_view valueName_39;
  string_view valueName_40;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view valueName_41;
  string_view desc;
  string_view desc_00;
  string_view desc_01;
  string_view desc_02;
  string_view desc_03;
  string_view desc_04;
  string_view desc_05;
  string_view desc_06;
  string_view desc_07;
  string_view desc_08;
  string_view desc_09;
  string_view desc_10;
  string_view desc_11;
  string_view desc_12;
  string_view desc_13;
  string_view desc_14;
  string_view desc_15;
  string_view desc_16;
  string_view desc_17;
  string_view desc_18;
  string_view desc_19;
  string_view desc_20;
  string_view desc_21;
  string_view desc_22;
  string_view desc_23;
  string_view desc_24;
  string_view desc_25;
  string_view desc_26;
  string_view desc_27;
  string_view desc_28;
  string_view desc_29;
  string_view desc_30;
  string_view desc_31;
  string_view desc_32;
  string_view desc_33;
  string_view desc_34;
  string_view desc_35;
  string_view desc_36;
  string_view desc_37;
  string_view desc_38;
  string_view desc_39;
  string_view desc_40;
  string_view desc_41;
  string_view desc_42;
  string_view desc_43;
  string_view desc_44;
  string_view desc_45;
  string_view desc_46;
  string_view desc_47;
  string_view desc_48;
  string_view desc_49;
  string_view desc_50;
  string_view desc_51;
  string_view desc_52;
  string_view desc_53;
  string_view desc_54;
  string_view desc_55;
  string_view desc_56;
  string_view desc_57;
  string_view desc_58;
  string_view desc_59;
  string_view desc_60;
  string_view desc_61;
  string_view desc_62;
  string_view desc_63;
  string_view desc_64;
  string_view desc_65;
  string_view desc_66;
  string_view desc_67;
  string_view desc_68;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view name_24;
  string_view name_25;
  string_view name_26;
  string_view name_27;
  string_view name_28;
  string_view name_29;
  string_view name_30;
  string_view name_31;
  string_view name_32;
  string_view name_33;
  string_view name_34;
  string_view name_35;
  string_view name_36;
  string_view name_37;
  string_view name_38;
  string_view name_39;
  string_view name_40;
  string_view name_41;
  string_view name_42;
  string_view name_43;
  string_view name_44;
  string_view name_45;
  string_view name_46;
  string_view name_47;
  string_view name_48;
  string_view name_49;
  string_view name_50;
  string_view name_51;
  string_view name_52;
  string_view name_53;
  string_view name_54;
  string_view name_55;
  string_view name_56;
  string_view name_57;
  string_view name_58;
  string_view name_59;
  string_view name_60;
  string_view name_61;
  string_view name_62;
  string_view name_63;
  string_view name_64;
  string_view name_65;
  string_view name_66;
  string_view name_67;
  string_view name_68;
  anon_class_8_1_8991fb9c addCompFlag;
  _Any_data local_210;
  code *local_200;
  code *local_1f8;
  _Any_data local_1f0;
  code *local_1e0;
  code *local_1d8;
  _Any_data local_1d0;
  code *local_1c0;
  code *local_1b8;
  _Any_data local_1b0;
  code *local_1a0;
  code *local_198;
  _Any_data local_190;
  code *local_180;
  code *local_178;
  _Any_data local_170;
  code *local_160;
  code *local_158;
  _Any_data local_150;
  code *local_140;
  code *local_138;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = &this->cmdLine;
  valueName._M_str = "(1800-2017 | 1800-2023 | latest)";
  valueName._M_len = 0x20;
  desc._M_str = "The version of the SystemVerilog language to use";
  desc._M_len = 0x30;
  name_14._M_str = "--std";
  name_14._M_len = 5;
  CommandLine::add(this_00,name_14,&(this->options).languageVersion,desc,valueName,
                   (bitmask<slang::CommandLineFlags>)0x0);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:56:9)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:56:9)>
             ::_M_manager;
  valueName_00._M_str = "<dir-pattern>[,...]";
  valueName_00._M_len = 0x13;
  desc_00._M_str = "Additional include search paths";
  desc_00._M_len = 0x1f;
  name_15._M_str = "-I,--include-directory,+incdir";
  name_15._M_len = 0x1e;
  local_50._M_unused._M_object = this;
  CommandLine::add(this_00,name_15,(OptionCallback *)&local_50,desc_00,valueName_00,
                   (bitmask<slang::CommandLineFlags>)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:66:9)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:66:9)>
             ::_M_manager;
  valueName_01._M_str = "<dir-pattern>[,...]";
  valueName_01._M_len = 0x13;
  desc_01._M_str = "Additional system include search paths";
  desc_01._M_len = 0x26;
  name_16._M_str = "--isystem";
  name_16._M_len = 9;
  local_70._M_unused._M_object = this;
  CommandLine::add(this_00,name_16,(OptionCallback *)&local_70,desc_01,valueName_01,
                   (bitmask<slang::CommandLineFlags>)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  valueName_02._M_str = "<macro>=<value>";
  valueName_02._M_len = 0xf;
  desc_02._M_str = "Define <macro> to <value> (or 1 if <value> ommitted) in all source files";
  desc_02._M_len = 0x48;
  name_17._M_str = "-D,--define-macro,+define";
  name_17._M_len = 0x19;
  CommandLine::add(this_00,name_17,&(this->options).defines,desc_02,valueName_02,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_03._M_str = "<macro>";
  valueName_03._M_len = 7;
  desc_03._M_str = "Undefine macro name at the start of all source files";
  desc_03._M_len = 0x34;
  name_18._M_str = "-U,--undefine-macro";
  name_18._M_len = 0x13;
  CommandLine::add(this_00,name_18,&(this->options).undefines,desc_03,valueName_03,
                   (bitmask<slang::CommandLineFlags>)0x2);
  valueName_04._M_str = "<depth>";
  valueName_04._M_len = 7;
  desc_04._M_str = "Maximum depth of nested include files allowed";
  desc_04._M_len = 0x2d;
  name_19._M_str = "--max-include-depth";
  name_19._M_len = 0x13;
  CommandLine::add(this_00,name_19,&(this->options).maxIncludeDepth,desc_04,valueName_04,
                   (bitmask<slang::CommandLineFlags>)0x0);
  desc_05._M_str =
       "If true, library files will inherit macro definitions from the primary source files. --single-unit must also be passed when this option is used."
  ;
  desc_05._M_len = 0x90;
  name_20._M_str = "--libraries-inherit-macros";
  name_20._M_len = 0x1a;
  CommandLine::add(this_00,name_20,&(this->options).librariesInheritMacros,desc_05,
                   (bitmask<slang::CommandLineFlags>)0x0);
  desc_06._M_str =
       "If true, the preprocessor will support legacy protected envelope directives, for compatibility with old Verilog tools"
  ;
  desc_06._M_len = 0x75;
  name_21._M_str = "--enable-legacy-protect";
  name_21._M_len = 0x17;
  CommandLine::add(this_00,name_21,&(this->options).enableLegacyProtect,desc_06,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_05._M_str = "<common>,<start>,<end>";
  valueName_05._M_len = 0x16;
  desc_07._M_str =
       "Set a format for comment directives that mark a region of disabled source text. The format is a common keyword, a start word, and an end word, each separated by commas. For example, \'pragma,translate_off,translate_on\'"
  ;
  desc_07._M_len = 0xd9;
  name_22._M_str = "--translate-off-format";
  name_22._M_len = 0x16;
  CommandLine::add(this_00,name_22,&(this->options).translateOffOptions,desc_07,valueName_05,
                   (bitmask<slang::CommandLineFlags>)0x0);
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:99:25)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:99:25)>
             ::_M_manager;
  valueName_06._M_str = "<vendor_cmd>,<N>";
  valueName_06._M_len = 0x10;
  desc_08._M_str =
       "Define rule to ignore vendor command <vendor_cmd> with its following <N> parameters.\nA command of the form +xyz will also match any vendor command of the form +xyz+abc,\nas +abc is the command\'s argument, and doesn\'t need to be matched."
  ;
  desc_08._M_len = 0xeb;
  name_23._M_str = "--cmd-ignore";
  name_23._M_len = 0xc;
  local_90._M_unused._M_object = this;
  CommandLine::add(this_00,name_23,(OptionCallback *)&local_90,desc_08,valueName_06,
                   (bitmask<slang::CommandLineFlags>)0x0);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:105:25)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:105:25)>
             ::_M_manager;
  valueName_07._M_str = "<vendor_cmd>,<slang_cmd>";
  valueName_07._M_len = 0x18;
  desc_09._M_str = "Define rule to rename vendor command <vendor_cmd> into existing <slang_cmd>";
  desc_09._M_len = 0x4b;
  name_24._M_str = "--cmd-rename";
  name_24._M_len = 0xc;
  local_b0._M_unused._M_object = this;
  CommandLine::add(this_00,name_24,(OptionCallback *)&local_b0,desc_09,valueName_07,
                   (bitmask<slang::CommandLineFlags>)0x0);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  valueName_08._M_str = "<directive>";
  valueName_08._M_len = 0xb;
  desc_10._M_str = "Ignore preprocessor directive and all its arguments until EOL";
  desc_10._M_len = 0x3d;
  name_25._M_str = "--ignore-directive";
  name_25._M_len = 0x12;
  CommandLine::add(this_00,name_25,&(this->options).ignoreDirectives,desc_10,valueName_08,
                   (bitmask<slang::CommandLineFlags>)0x2);
  valueName_09._M_str = "<depth>";
  valueName_09._M_len = 7;
  desc_11._M_str = "Maximum depth of nested language constructs allowed";
  desc_11._M_len = 0x33;
  name_26._M_str = "--max-parse-depth";
  name_26._M_len = 0x11;
  CommandLine::add(this_00,name_26,&(this->options).maxParseDepth,desc_11,valueName_09,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_10._M_str = "<count>";
  valueName_10._M_len = 7;
  desc_12._M_str =
       "Maximum number of errors that can occur during lexing before the rest of the file is skipped"
  ;
  desc_12._M_len = 0x5c;
  name_27._M_str = "--max-lexer-errors";
  name_27._M_len = 0x12;
  CommandLine::add(this_00,name_27,&(this->options).maxLexerErrors,desc_12,valueName_10,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_11._M_str = "<count>";
  valueName_11._M_len = 7;
  desc_13._M_str = "The number of threads to use to parallelize parsing";
  desc_13._M_len = 0x33;
  name_28._M_str = "-j,--threads";
  name_28._M_len = 0xc;
  CommandLine::add(this_00,name_28,&(this->options).numThreads,desc_13,valueName_11,
                   (bitmask<slang::CommandLineFlags>)0x0);
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:124:9)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:124:9)>
             ::_M_manager;
  valueName_12._M_str = "<file-pattern>[,...]";
  valueName_12._M_len = 0x14;
  desc_14._M_str =
       "One or more files containing independent compilation unit listings. The files accept a subset of options that pertain specifically to parsing that unit and optionally including it in a library."
  ;
  desc_14._M_len = 0xc1;
  name_29._M_str = "-C";
  name_29._M_len = 2;
  local_d0._M_unused._M_object = this;
  CommandLine::add(this_00,name_29,(OptionCallback *)&local_d0,desc_14,valueName_12,
                   (bitmask<slang::CommandLineFlags>)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  valueName_13._M_str = "<depth>";
  valueName_13._M_len = 7;
  desc_15._M_str = "Maximum depth of the design hierarchy";
  desc_15._M_len = 0x25;
  name_30._M_str = "--max-hierarchy-depth";
  name_30._M_len = 0x15;
  CommandLine::add(this_00,name_30,&(this->options).maxInstanceDepth,desc_15,valueName_13,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_14._M_str = "<steps>";
  valueName_14._M_len = 7;
  desc_16._M_str =
       "Maximum number of steps that can occur during generate block evaluation before giving up";
  desc_16._M_len = 0x58;
  name_31._M_str = "--max-generate-steps";
  name_31._M_len = 0x14;
  CommandLine::add(this_00,name_31,&(this->options).maxGenerateSteps,desc_16,valueName_14,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_15._M_str = "<depth>";
  valueName_15._M_len = 7;
  desc_17._M_str = "Maximum depth of a constant evaluation call stack";
  desc_17._M_len = 0x31;
  name_32._M_str = "--max-constexpr-depth";
  name_32._M_len = 0x15;
  CommandLine::add(this_00,name_32,&(this->options).maxConstexprDepth,desc_17,valueName_15,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_16._M_str = "<steps>";
  valueName_16._M_len = 7;
  desc_18._M_str =
       "Maximum number of steps that can occur during constant evaluation before giving up";
  desc_18._M_len = 0x52;
  name_33._M_str = "--max-constexpr-steps";
  name_33._M_len = 0x15;
  CommandLine::add(this_00,name_33,&(this->options).maxConstexprSteps,desc_18,valueName_16,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_17._M_str = "<limit>";
  valueName_17._M_len = 7;
  desc_19._M_str =
       "Maximum number of frames to show when printing a constant evaluation backtrace; the rest will be abbreviated"
  ;
  desc_19._M_len = 0x6c;
  name_34._M_str = "--constexpr-backtrace-limit";
  name_34._M_len = 0x1b;
  CommandLine::add(this_00,name_34,&(this->options).maxConstexprBacktrace,desc_19,valueName_17,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_18._M_str = "<limit>";
  valueName_18._M_len = 7;
  desc_20._M_str = "Maximum number of instances allowed in a single instance array";
  desc_20._M_len = 0x3e;
  name_35._M_str = "--max-instance-array";
  name_35._M_len = 0x14;
  CommandLine::add(this_00,name_35,&(this->options).maxInstanceArray,desc_20,valueName_18,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_19._M_str = "<limit>";
  valueName_19._M_len = 7;
  desc_21._M_str =
       "Maximum number of UDP coverage notes that will be generated for a single warning about missing edge transitions"
  ;
  desc_21._M_len = 0x6f;
  name_36._M_str = "--max-udp-coverage-notes";
  name_36._M_len = 0x18;
  CommandLine::add(this_00,name_36,&(this->options).maxUDPCoverageNotes,desc_21,valueName_19,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_20._M_str = "vcs";
  valueName_20._M_len = 3;
  desc_22._M_str = "Attempt to increase compatibility with the specified tool";
  desc_22._M_len = 0x39;
  name_37._M_str = "--compat";
  name_37._M_len = 8;
  CommandLine::add(this_00,name_37,&(this->options).compat,desc_22,valueName_20,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_21._M_str = "min|typ|max";
  valueName_21._M_len = 0xb;
  desc_23._M_str = "Select which value to consider in min:typ:max expressions";
  desc_23._M_len = 0x39;
  name_38._M_str = "-T,--timing";
  name_38._M_len = 0xb;
  CommandLine::add(this_00,name_38,&(this->options).minTypMax,desc_23,valueName_21,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_22._M_str = "<base>/<precision>";
  valueName_22._M_len = 0x12;
  desc_24._M_str =
       "Default time scale to use for design elements that don\'t specify one explicitly";
  desc_24._M_len = 0x4f;
  name_39._M_str = "--timescale";
  name_39._M_len = 0xb;
  CommandLine::add(this_00,name_39,&(this->options).timeScale,desc_24,valueName_22,
                   (bitmask<slang::CommandLineFlags>)0x0);
  name._M_str = "--allow-use-before-declare";
  name._M_len = 0x1a;
  desc_25._M_str = "Don\'t issue an error for use of names before their declarations";
  desc_25._M_len = 0x3f;
  addCompFlag.this = this;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,AllowUseBeforeDeclare,name,desc_25);
  name_00._M_str = "--ignore-unknown-modules";
  name_00._M_len = 0x18;
  desc_26._M_str =
       "Don\'t issue an error for instantiations of unknown modules, interface, and programs";
  desc_26._M_len = 0x53;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,IgnoreUnknownModules,name_00,desc_26);
  name_01._M_str = "--relax-enum-conversions";
  name_01._M_len = 0x18;
  desc_27._M_str = "Allow all integral types to convert implicitly to enum types";
  desc_27._M_len = 0x3c;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,RelaxEnumConversions,name_01,desc_27);
  name_02._M_str = "--relax-string-conversions";
  name_02._M_len = 0x1a;
  desc_28._M_str = "Allow string types to convert implicitly to integral types";
  desc_28._M_len = 0x3a;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,RelaxStringConversions,name_02,desc_28);
  name_03._M_str = "--allow-hierarchical-const";
  name_03._M_len = 0x1a;
  desc_29._M_str = "Allow hierarchical references in constant expressions";
  desc_29._M_len = 0x35;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,AllowHierarchicalConst,name_03,desc_29);
  name_04._M_str = "--allow-dup-initial-drivers";
  name_04._M_len = 0x1b;
  desc_30._M_str =
       "Allow signals driven in an always_comb or always_ff block to also be driven by initial blocks"
  ;
  desc_30._M_len = 0x5d;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,AllowDupInitialDrivers,name_04,desc_30);
  name_05._M_str = "--allow-toplevel-iface-ports";
  name_05._M_len = 0x1c;
  desc_31._M_str = "Allow top-level modules to have interface ports";
  desc_31._M_len = 0x2f;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,AllowTopLevelIfacePorts,name_05,desc_31);
  name_06._M_str = "--allow-recursive-implicit-call";
  name_06._M_len = 0x1f;
  desc_32._M_str = "Allow implicit call expressions to be recursive function calls";
  desc_32._M_len = 0x3e;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,AllowRecursiveImplicitCall,name_06,desc_32);
  name_07._M_str = "--allow-bare-value-param-assigment";
  name_07._M_len = 0x22;
  desc_33._M_str = "Allow module parameter assignments to elide the parentheses";
  desc_33._M_len = 0x3b;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,AllowBareValParamAssignment,name_07,desc_33);
  name_08._M_str = "--allow-self-determined-stream-concat";
  name_08._M_len = 0x25;
  desc_34._M_str = "Allow self-determined streaming concatenation expressions";
  desc_34._M_len = 0x39;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,AllowSelfDeterminedStreamConcat,name_08,desc_34);
  name_09._M_str = "--allow-multi-driven-locals";
  name_09._M_len = 0x1b;
  desc_35._M_str =
       "Allow subroutine local variables to be driven from multiple always_comb/_ff blocks";
  desc_35._M_len = 0x52;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,AllowMultiDrivenLocals,name_09,desc_35);
  name_10._M_str = "--allow-merging-ansi-ports";
  name_10._M_len = 0x1a;
  desc_36._M_str =
       "Allow merging ANSI port declarations with nets and variables declared in the instance body";
  desc_36._M_len = 0x5a;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,AllowMergingAnsiPorts,name_10,desc_36);
  name_11._M_str = "--strict-driver-checking";
  name_11._M_len = 0x18;
  desc_37._M_str =
       "Perform strict driver checking, which currently means disabling procedural \'for\' loop unrolling"
  ;
  desc_37._M_len = 0x5f;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,StrictDriverChecking,name_11,desc_37);
  name_12._M_str = "--lint-only";
  name_12._M_len = 0xb;
  desc_38._M_str = "Only perform linting of code, don\'t try to elaborate a full hierarchy";
  desc_38._M_len = 0x45;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()(&addCompFlag,LintMode,name_12,desc_38);
  name_13._M_str = "--disable-instance-caching";
  name_13._M_len = 0x1a;
  desc_39._M_str =
       "Disable the use of instance caching, which normally allows skipping duplicate instance bodies to save time when elaborating"
  ;
  desc_39._M_len = 0x7b;
  addStandardArgs::anon_class_8_1_8991fb9c::operator()
            (&addCompFlag,DisableInstanceCaching,name_13,desc_39);
  valueName_23._M_str = "<name>";
  valueName_23._M_len = 6;
  desc_40._M_str =
       "One or more top-level modules to instantiate (instead of figuring it out automatically)";
  desc_40._M_len = 0x57;
  name_40._M_str = "--top";
  name_40._M_len = 5;
  CommandLine::add(this_00,name_40,&(this->options).topModules,desc_40,valueName_23,
                   (bitmask<slang::CommandLineFlags>)0x2);
  valueName_24._M_str = "<name>=<value>";
  valueName_24._M_len = 0xe;
  desc_41._M_str = "One or more parameter overrides to apply when instantiating top-level modules";
  desc_41._M_len = 0x4d;
  name_41._M_str = "-G";
  name_41._M_len = 2;
  CommandLine::add(this_00,name_41,&(this->options).paramOverrides,desc_41,valueName_24,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_25._M_str = "<library>";
  valueName_25._M_len = 9;
  desc_42._M_str = "A list of library names that controls the priority order for module lookup";
  desc_42._M_len = 0x4a;
  name_42._M_str = "-L";
  name_42._M_len = 2;
  CommandLine::add(this_00,name_42,&(this->options).libraryOrder,desc_42,valueName_25,
                   (bitmask<slang::CommandLineFlags>)0x2);
  valueName_26._M_str = "<name>";
  valueName_26._M_len = 6;
  desc_43._M_str = "Sets the name of the default library";
  desc_43._M_len = 0x24;
  name_43._M_str = "--defaultLibName";
  name_43._M_len = 0x10;
  CommandLine::add(this_00,name_43,&(this->options).defaultLibName,desc_43,valueName_26,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_27._M_str = "<warning>";
  valueName_27._M_len = 9;
  desc_44._M_str = "Control the specified warning";
  desc_44._M_len = 0x1d;
  name_44._M_str = "-W";
  name_44._M_len = 2;
  CommandLine::add(this_00,name_44,&(this->options).warningOptions,desc_44,valueName_27,
                   (bitmask<slang::CommandLineFlags>)0x0);
  desc_45._M_str =
       "Always print diagnostics in color. If this option is unset, colors will be enabled if a color-capable terminal is detected."
  ;
  desc_45._M_len = 0x7b;
  name_45._M_str = "--color-diagnostics";
  name_45._M_len = 0x13;
  CommandLine::add(this_00,name_45,&(this->options).colorDiags,desc_45,
                   (bitmask<slang::CommandLineFlags>)0x0);
  desc_46._M_str = "Show column numbers in diagnostic output";
  desc_46._M_len = 0x28;
  name_46._M_str = "--diag-column";
  name_46._M_len = 0xd;
  CommandLine::add(this_00,name_46,&(this->options).diagColumn,desc_46,
                   (bitmask<slang::CommandLineFlags>)0x0);
  desc_47._M_str = "Show location information in diagnostic output";
  desc_47._M_len = 0x2e;
  name_47._M_str = "--diag-location";
  name_47._M_len = 0xf;
  CommandLine::add(this_00,name_47,&(this->options).diagLocation,desc_47,
                   (bitmask<slang::CommandLineFlags>)0x0);
  desc_48._M_str = "Show source line or caret info in diagnostic output";
  desc_48._M_len = 0x33;
  name_48._M_str = "--diag-source";
  name_48._M_len = 0xd;
  CommandLine::add(this_00,name_48,&(this->options).diagSourceLine,desc_48,
                   (bitmask<slang::CommandLineFlags>)0x0);
  desc_49._M_str = "Show option names in diagnostic output";
  desc_49._M_len = 0x26;
  name_49._M_str = "--diag-option";
  name_49._M_len = 0xd;
  CommandLine::add(this_00,name_49,&(this->options).diagOptionName,desc_49,
                   (bitmask<slang::CommandLineFlags>)0x0);
  desc_50._M_str = "Show include stacks in diagnostic output";
  desc_50._M_len = 0x28;
  name_50._M_str = "--diag-include-stack";
  name_50._M_len = 0x14;
  CommandLine::add(this_00,name_50,&(this->options).diagIncludeStack,desc_50,
                   (bitmask<slang::CommandLineFlags>)0x0);
  desc_51._M_str = "Show macro expansion backtraces in diagnostic output";
  desc_51._M_len = 0x34;
  name_51._M_str = "--diag-macro-expansion";
  name_51._M_len = 0x16;
  CommandLine::add(this_00,name_51,&(this->options).diagMacroExpansion,desc_51,
                   (bitmask<slang::CommandLineFlags>)0x0);
  desc_52._M_str = "Display absolute paths to files in diagnostic output";
  desc_52._M_len = 0x34;
  name_52._M_str = "--diag-abs-paths";
  name_52._M_len = 0x10;
  CommandLine::add(this_00,name_52,&(this->options).diagAbsPaths,desc_52,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_28._M_str = "always|never|auto";
  valueName_28._M_len = 0x11;
  desc_53._M_str = "Show hierarchy locations in diagnostic output";
  desc_53._M_len = 0x2d;
  name_53._M_str = "--diag-hierarchy";
  name_53._M_len = 0x10;
  CommandLine::add(this_00,name_53,&(this->options).diagHierarchy,desc_53,valueName_28,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_29._M_str = "<file>";
  valueName_29._M_len = 6;
  desc_54._M_str = "Dump all diagnostics in JSON format to the specified file, or \'-\' for stdout";
  desc_54._M_len = 0x4c;
  name_54._M_str = "--diag-json";
  name_54._M_len = 0xb;
  CommandLine::add(this_00,name_54,&(this->options).diagJson,desc_54,valueName_29,
                   (bitmask<slang::CommandLineFlags>)0x1);
  valueName_30._M_str = "<limit>";
  valueName_30._M_len = 7;
  desc_55._M_str =
       "Limit on the number of errors that will be printed. Setting this to zero will disable the limit."
  ;
  desc_55._M_len = 0x60;
  name_55._M_str = "--error-limit";
  name_55._M_len = 0xd;
  CommandLine::add(this_00,name_55,&(this->options).errorLimit,desc_55,valueName_30,
                   (bitmask<slang::CommandLineFlags>)0x0);
  local_f0._8_8_ = 0;
  local_d8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:251:9)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:251:9)>
             ::_M_manager;
  valueName_31._M_str = "<file-pattern>[,...]";
  valueName_31._M_len = 0x14;
  desc_56._M_str = "One or more paths in which to suppress warnings";
  desc_56._M_len = 0x2f;
  name_56._M_str = "--suppress-warnings";
  name_56._M_len = 0x13;
  local_f0._M_unused._M_object = this;
  CommandLine::add(this_00,name_56,(OptionCallback *)&local_f0,desc_56,valueName_31,
                   (bitmask<slang::CommandLineFlags>)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_f0);
  local_110._8_8_ = 0;
  local_f8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:261:9)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:261:9)>
              ::_M_manager;
  valueName_32._M_str = "<file-pattern>[,...]";
  valueName_32._M_len = 0x14;
  desc_57._M_str =
       "One or more paths in which to suppress warnings that originate in macro expansions";
  desc_57._M_len = 0x52;
  name_57._M_str = "--suppress-macro-warnings";
  name_57._M_len = 0x19;
  local_110._M_unused._M_object = this;
  CommandLine::add(this_00,name_57,(OptionCallback *)&local_110,desc_57,valueName_32,
                   (bitmask<slang::CommandLineFlags>)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_110);
  desc_58._M_str = "Treat all input files as a single compilation unit";
  desc_58._M_len = 0x32;
  name_58._M_str = "--single-unit";
  name_58._M_len = 0xd;
  CommandLine::add(this_00,name_58,&(this->options).singleUnit,desc_58,
                   (bitmask<slang::CommandLineFlags>)0x0);
  local_130._8_8_ = 0;
  local_118 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:278:9)>
              ::_M_invoke;
  local_120 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:278:9)>
              ::_M_manager;
  valueName_33._M_str = "<file-pattern>[,...]";
  valueName_33._M_len = 0x14;
  desc_59._M_str =
       "One or more library files, which are separate compilation units where modules are not automatically instantiated"
  ;
  desc_59._M_len = 0x70;
  name_59._M_str = "-v,--libfile";
  name_59._M_len = 0xc;
  local_130._M_unused._M_object = this;
  CommandLine::add(this_00,name_59,(OptionCallback *)&local_130,desc_59,valueName_33,
                   (bitmask<slang::CommandLineFlags>)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_130);
  local_150._8_8_ = 0;
  local_138 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:288:9)>
              ::_M_invoke;
  local_140 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:288:9)>
              ::_M_manager;
  valueName_34._M_str = "<file-pattern>[,...]";
  valueName_34._M_len = 0x14;
  desc_60._M_str = "One or more library map files to parse for library name mappings and file lists"
  ;
  desc_60._M_len = 0x4f;
  name_60._M_str = "--libmap";
  name_60._M_len = 8;
  local_150._M_unused._M_object = this;
  CommandLine::add(this_00,name_60,(OptionCallback *)&local_150,desc_60,valueName_34,
                   (bitmask<slang::CommandLineFlags>)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_150);
  local_170._8_8_ = 0;
  local_158 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:300:9)>
              ::_M_invoke;
  local_160 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:300:9)>
              ::_M_manager;
  valueName_35._M_str = "<dir-pattern>[,...]";
  valueName_35._M_len = 0x13;
  desc_61._M_str = "Library search paths, which will be searched for missing modules";
  desc_61._M_len = 0x40;
  name_61._M_str = "-y,--libdir";
  name_61._M_len = 0xb;
  local_170._M_unused._M_object = this;
  CommandLine::add(this_00,name_61,(OptionCallback *)&local_170,desc_61,valueName_35,
                   (bitmask<slang::CommandLineFlags>)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_170);
  local_190._8_8_ = 0;
  local_178 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:309:9)>
              ::_M_invoke;
  local_180 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:309:9)>
              ::_M_manager;
  valueName_36._M_str = "<ext>";
  valueName_36._M_len = 5;
  desc_62._M_str = "Additional library file extensions to search";
  desc_62._M_len = 0x2c;
  name_62._M_str = "-Y,--libext";
  name_62._M_len = 0xb;
  local_190._M_unused._M_object = this;
  CommandLine::add(this_00,name_62,(OptionCallback *)&local_190,desc_62,valueName_36,
                   (bitmask<slang::CommandLineFlags>)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_190);
  local_1b0._8_8_ = 0;
  local_198 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:317:9)>
              ::_M_invoke;
  local_1a0 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:317:9)>
              ::_M_manager;
  valueName_37._M_str = "<ext>";
  valueName_37._M_len = 5;
  desc_63._M_str = "Exclude provided source files with these extensions";
  desc_63._M_len = 0x33;
  name_63._M_str = "--exclude-ext";
  name_63._M_len = 0xd;
  local_1b0._M_unused._M_object = this;
  CommandLine::add(this_00,name_63,(OptionCallback *)&local_1b0,desc_63,valueName_37,
                   (bitmask<slang::CommandLineFlags>)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_1b0);
  local_1d0._8_8_ = 0;
  local_1b8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:325:9)>
              ::_M_invoke;
  local_1c0 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:325:9)>
              ::_M_manager;
  valueName_41._M_str = "files";
  valueName_41._M_len = 5;
  local_1d0._M_unused._M_object = this;
  CommandLine::setPositional
            (this_00,(OptionCallback *)&local_1d0,valueName_41,(bitmask<slang::CommandLineFlags>)0x0
            );
  std::_Function_base::~_Function_base((_Function_base *)&local_1d0);
  local_1f0._8_8_ = 0;
  local_1d8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:340:9)>
              ::_M_invoke;
  local_1e0 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:340:9)>
              ::_M_manager;
  valueName_38._M_str = "<file-pattern>[,...]";
  valueName_38._M_len = 0x14;
  desc_64._M_str =
       "One or more command files containing additional program options. Paths in the file are considered relative to the current directory."
  ;
  desc_64._M_len = 0x84;
  name_64._M_str = "-f";
  name_64._M_len = 2;
  local_1f0._M_unused._M_object = this;
  CommandLine::add(this_00,name_64,(OptionCallback *)&local_1f0,desc_64,valueName_38,
                   (bitmask<slang::CommandLineFlags>)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_1f0);
  local_210._8_8_ = 0;
  local_1f8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:350:9)>
              ::_M_invoke;
  local_200 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/Driver.cpp:350:9)>
              ::_M_manager;
  valueName_39._M_str = "<file-pattern>[,...]";
  valueName_39._M_len = 0x14;
  desc_65._M_str =
       "One or more command files containing additional program options. Paths in the file are considered relative to the file itself."
  ;
  desc_65._M_len = 0x7e;
  name_65._M_str = "-F";
  name_65._M_len = 2;
  local_210._M_unused._M_object = this;
  CommandLine::add(this_00,name_65,(OptionCallback *)&local_210,desc_65,valueName_39,
                   (bitmask<slang::CommandLineFlags>)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_210);
  desc_66._M_str =
       "Respect the \'unique\' and \'priority\' keywords when analyzing data flow through case statements"
  ;
  desc_66._M_len = 0x5d;
  name_66._M_str = "--dfa-unique-priority";
  name_66._M_len = 0x15;
  CommandLine::add(this_00,name_66,&(this->options).dfaUniquePriority,desc_66,
                   (bitmask<slang::CommandLineFlags>)0x0);
  desc_67._M_str =
       "Require that case items cover X and Z bits to assume full coverage in data flow analysis";
  desc_67._M_len = 0x58;
  name_67._M_str = "--dfa-four-state";
  name_67._M_len = 0x10;
  CommandLine::add(this_00,name_67,&(this->options).dfaFourState,desc_67,
                   (bitmask<slang::CommandLineFlags>)0x0);
  valueName_40._M_str = "<steps>";
  valueName_40._M_len = 7;
  desc_68._M_str = "Maximum number of steps that can occur during case analysis before giving up";
  desc_68._M_len = 0x4c;
  name_68._M_str = "--max-case-analysis-steps";
  name_68._M_len = 0x19;
  CommandLine::add(this_00,name_68,&(this->options).maxCaseAnalysisSteps,desc_68,valueName_40,
                   (bitmask<slang::CommandLineFlags>)0x0);
  return;
}

Assistant:

void Driver::addStandardArgs() {
    cmdLine.add("--std", options.languageVersion,
                "The version of the SystemVerilog language to use",
                "(1800-2017 | 1800-2023 | latest)");

    // Include paths
    cmdLine.add(
        "-I,--include-directory,+incdir",
        [this](std::string_view value) {
            if (auto ec = sourceManager.addUserDirectories(value)) {
                printWarning(fmt::format("include directory '{}': {}", value, ec.message()));
            }
            return "";
        },
        "Additional include search paths", "<dir-pattern>[,...]", CommandLineFlags::CommaList);

    cmdLine.add(
        "--isystem",
        [this](std::string_view value) {
            if (auto ec = sourceManager.addSystemDirectories(value)) {
                printWarning(fmt::format("system include directory '{}': {}", value, ec.message()));
            }
            return "";
        },
        "Additional system include search paths", "<dir-pattern>[,...]",
        CommandLineFlags::CommaList);

    // Preprocessor
    cmdLine.add("-D,--define-macro,+define", options.defines,
                "Define <macro> to <value> (or 1 if <value> ommitted) in all source files",
                "<macro>=<value>");
    cmdLine.add("-U,--undefine-macro", options.undefines,
                "Undefine macro name at the start of all source files", "<macro>",
                CommandLineFlags::CommaList);
    cmdLine.add("--max-include-depth", options.maxIncludeDepth,
                "Maximum depth of nested include files allowed", "<depth>");
    cmdLine.add("--libraries-inherit-macros", options.librariesInheritMacros,
                "If true, library files will inherit macro definitions from the primary source "
                "files. --single-unit must also be passed when this option is used.");
    cmdLine.add("--enable-legacy-protect", options.enableLegacyProtect,
                "If true, the preprocessor will support legacy protected envelope directives, "
                "for compatibility with old Verilog tools");
    cmdLine.add("--translate-off-format", options.translateOffOptions,
                "Set a format for comment directives that mark a region of disabled "
                "source text. The format is a common keyword, a start word, and an "
                "end word, each separated by commas. For example, "
                "'pragma,translate_off,translate_on'",
                "<common>,<start>,<end>");

    // Legacy vendor commands support
    cmdLine.add(
        "--cmd-ignore", [this](std::string_view value) { return cmdLine.addIgnoreCommand(value); },
        "Define rule to ignore vendor command <vendor_cmd> with its following <N> parameters.\n"
        "A command of the form +xyz will also match any vendor command of the form +xyz+abc,\n"
        "as +abc is the command's argument, and doesn't need to be matched.",
        "<vendor_cmd>,<N>");
    cmdLine.add(
        "--cmd-rename", [this](std::string_view value) { return cmdLine.addRenameCommand(value); },
        "Define rule to rename vendor command <vendor_cmd> into existing <slang_cmd>",
        "<vendor_cmd>,<slang_cmd>");
    cmdLine.add("--ignore-directive", options.ignoreDirectives,
                "Ignore preprocessor directive and all its arguments until EOL", "<directive>",
                CommandLineFlags::CommaList);

    // Parsing
    cmdLine.add("--max-parse-depth", options.maxParseDepth,
                "Maximum depth of nested language constructs allowed", "<depth>");
    cmdLine.add("--max-lexer-errors", options.maxLexerErrors,
                "Maximum number of errors that can occur during lexing before the rest of the file "
                "is skipped",
                "<count>");
    cmdLine.add("-j,--threads", options.numThreads,
                "The number of threads to use to parallelize parsing", "<count>");

    cmdLine.add(
        "-C",
        [this](std::string_view value) {
            processCommandFiles(value, /* makeRelative */ true, /* separateUnit */ true);
            return "";
        },
        "One or more files containing independent compilation unit listings. "
        "The files accept a subset of options that pertain specifically to parsing "
        "that unit and optionally including it in a library.",
        "<file-pattern>[,...]", CommandLineFlags::CommaList);

    // Compilation
    cmdLine.add("--max-hierarchy-depth", options.maxInstanceDepth,
                "Maximum depth of the design hierarchy", "<depth>");
    cmdLine.add("--max-generate-steps", options.maxGenerateSteps,
                "Maximum number of steps that can occur during generate block "
                "evaluation before giving up",
                "<steps>");
    cmdLine.add("--max-constexpr-depth", options.maxConstexprDepth,
                "Maximum depth of a constant evaluation call stack", "<depth>");
    cmdLine.add("--max-constexpr-steps", options.maxConstexprSteps,
                "Maximum number of steps that can occur during constant "
                "evaluation before giving up",
                "<steps>");
    cmdLine.add("--constexpr-backtrace-limit", options.maxConstexprBacktrace,
                "Maximum number of frames to show when printing a constant evaluation "
                "backtrace; the rest will be abbreviated",
                "<limit>");
    cmdLine.add("--max-instance-array", options.maxInstanceArray,
                "Maximum number of instances allowed in a single instance array", "<limit>");
    cmdLine.add("--max-udp-coverage-notes", options.maxUDPCoverageNotes,
                "Maximum number of UDP coverage notes that will be generated for a single "
                "warning about missing edge transitions",
                "<limit>");
    cmdLine.add("--compat", options.compat,
                "Attempt to increase compatibility with the specified tool", "vcs");
    cmdLine.add("-T,--timing", options.minTypMax,
                "Select which value to consider in min:typ:max expressions", "min|typ|max");
    cmdLine.add("--timescale", options.timeScale,
                "Default time scale to use for design elements that don't specify one explicitly",
                "<base>/<precision>");

    auto addCompFlag = [&](CompilationFlags flag, std::string_view name, std::string_view desc) {
        auto [it, inserted] = options.compilationFlags.emplace(flag, std::nullopt);
        SLANG_ASSERT(inserted);
        cmdLine.add(name, it->second, desc);
    };

    addCompFlag(CompilationFlags::AllowUseBeforeDeclare, "--allow-use-before-declare",
                "Don't issue an error for use of names before their declarations");
    addCompFlag(CompilationFlags::IgnoreUnknownModules, "--ignore-unknown-modules",
                "Don't issue an error for instantiations of unknown modules, "
                "interface, and programs");
    addCompFlag(CompilationFlags::RelaxEnumConversions, "--relax-enum-conversions",
                "Allow all integral types to convert implicitly to enum types");
    addCompFlag(CompilationFlags::RelaxStringConversions, "--relax-string-conversions",
                "Allow string types to convert implicitly to integral types");
    addCompFlag(CompilationFlags::AllowHierarchicalConst, "--allow-hierarchical-const",
                "Allow hierarchical references in constant expressions");
    addCompFlag(CompilationFlags::AllowDupInitialDrivers, "--allow-dup-initial-drivers",
                "Allow signals driven in an always_comb or always_ff block to also be driven "
                "by initial blocks");
    addCompFlag(CompilationFlags::AllowTopLevelIfacePorts, "--allow-toplevel-iface-ports",
                "Allow top-level modules to have interface ports");
    addCompFlag(CompilationFlags::AllowRecursiveImplicitCall, "--allow-recursive-implicit-call",
                "Allow implicit call expressions to be recursive function calls");
    addCompFlag(CompilationFlags::AllowBareValParamAssignment, "--allow-bare-value-param-assigment",
                "Allow module parameter assignments to elide the parentheses");
    addCompFlag(CompilationFlags::AllowSelfDeterminedStreamConcat,
                "--allow-self-determined-stream-concat",
                "Allow self-determined streaming concatenation expressions");
    addCompFlag(
        CompilationFlags::AllowMultiDrivenLocals, "--allow-multi-driven-locals",
        "Allow subroutine local variables to be driven from multiple always_comb/_ff blocks");
    addCompFlag(CompilationFlags::AllowMergingAnsiPorts, "--allow-merging-ansi-ports",
                "Allow merging ANSI port declarations with nets and variables declared in the "
                "instance body");
    addCompFlag(CompilationFlags::StrictDriverChecking, "--strict-driver-checking",
                "Perform strict driver checking, which currently means disabling "
                "procedural 'for' loop unrolling");
    addCompFlag(CompilationFlags::LintMode, "--lint-only",
                "Only perform linting of code, don't try to elaborate a full hierarchy");
    addCompFlag(CompilationFlags::DisableInstanceCaching, "--disable-instance-caching",
                "Disable the use of instance caching, which normally allows skipping duplicate "
                "instance bodies to save time when elaborating");

    cmdLine.add("--top", options.topModules,
                "One or more top-level modules to instantiate "
                "(instead of figuring it out automatically)",
                "<name>", CommandLineFlags::CommaList);
    cmdLine.add("-G", options.paramOverrides,
                "One or more parameter overrides to apply when instantiating top-level modules",
                "<name>=<value>");
    cmdLine.add("-L", options.libraryOrder,
                "A list of library names that controls the priority order for module lookup",
                "<library>", CommandLineFlags::CommaList);
    cmdLine.add("--defaultLibName", options.defaultLibName, "Sets the name of the default library",
                "<name>");

    // Diagnostics control
    cmdLine.add("-W", options.warningOptions, "Control the specified warning", "<warning>");
    cmdLine.add("--color-diagnostics", options.colorDiags,
                "Always print diagnostics in color. "
                "If this option is unset, colors will be enabled if a color-capable "
                "terminal is detected.");
    cmdLine.add("--diag-column", options.diagColumn, "Show column numbers in diagnostic output");
    cmdLine.add("--diag-location", options.diagLocation,
                "Show location information in diagnostic output");
    cmdLine.add("--diag-source", options.diagSourceLine,
                "Show source line or caret info in diagnostic output");
    cmdLine.add("--diag-option", options.diagOptionName, "Show option names in diagnostic output");
    cmdLine.add("--diag-include-stack", options.diagIncludeStack,
                "Show include stacks in diagnostic output");
    cmdLine.add("--diag-macro-expansion", options.diagMacroExpansion,
                "Show macro expansion backtraces in diagnostic output");
    cmdLine.add("--diag-abs-paths", options.diagAbsPaths,
                "Display absolute paths to files in diagnostic output");
    cmdLine.add("--diag-hierarchy", options.diagHierarchy,
                "Show hierarchy locations in diagnostic output", "always|never|auto");
    cmdLine.add("--diag-json", options.diagJson,
                "Dump all diagnostics in JSON format to the specified file, or '-' for stdout",
                "<file>", CommandLineFlags::FilePath);
    cmdLine.add("--error-limit", options.errorLimit,
                "Limit on the number of errors that will be printed. Setting this to zero will "
                "disable the limit.",
                "<limit>");

    cmdLine.add(
        "--suppress-warnings",
        [this](std::string_view value) {
            if (auto ec = diagEngine.addIgnorePaths(value))
                printWarning(fmt::format("--suppress-warnings path '{}': {}", value, ec.message()));
            return "";
        },
        "One or more paths in which to suppress warnings", "<file-pattern>[,...]",
        CommandLineFlags::CommaList);

    cmdLine.add(
        "--suppress-macro-warnings",
        [this](std::string_view value) {
            if (auto ec = diagEngine.addIgnoreMacroPaths(value)) {
                printWarning(
                    fmt::format("--suppress-macro-warnings path '{}': {}", value, ec.message()));
            }
            return "";
        },
        "One or more paths in which to suppress warnings that "
        "originate in macro expansions",
        "<file-pattern>[,...]", CommandLineFlags::CommaList);

    // File lists
    cmdLine.add("--single-unit", options.singleUnit,
                "Treat all input files as a single compilation unit");

    cmdLine.add(
        "-v,--libfile",
        [this](std::string_view value) {
            addLibraryFiles(value);
            return "";
        },
        "One or more library files, which are separate compilation units "
        "where modules are not automatically instantiated",
        "<file-pattern>[,...]", CommandLineFlags::CommaList);

    cmdLine.add(
        "--libmap",
        [this](std::string_view value) {
            Bag optionBag;
            addParseOptions(optionBag);
            sourceLoader.addLibraryMaps(value, {}, optionBag);
            return "";
        },
        "One or more library map files to parse "
        "for library name mappings and file lists",
        "<file-pattern>[,...]", CommandLineFlags::CommaList);

    cmdLine.add(
        "-y,--libdir",
        [this](std::string_view value) {
            sourceLoader.addSearchDirectories(value);
            return "";
        },
        "Library search paths, which will be searched for missing modules", "<dir-pattern>[,...]",
        CommandLineFlags::CommaList);

    cmdLine.add(
        "-Y,--libext",
        [this](std::string_view value) {
            sourceLoader.addSearchExtension(value);
            return "";
        },
        "Additional library file extensions to search", "<ext>", CommandLineFlags::CommaList);

    cmdLine.add(
        "--exclude-ext",
        [this](std::string_view value) {
            options.excludeExts.emplace(std::string(value));
            return "";
        },
        "Exclude provided source files with these extensions", "<ext>",
        CommandLineFlags::CommaList);

    cmdLine.setPositional(
        [this](std::string_view value) {
            if (!options.excludeExts.empty()) {
                if (size_t extIndex = value.find_last_of('.'); extIndex != std::string_view::npos) {
                    if (options.excludeExts.count(std::string(value.substr(extIndex + 1))))
                        return "";
                }
            }

            sourceLoader.addFiles(value);
            return "";
        },
        "files");

    cmdLine.add(
        "-f",
        [this](std::string_view value) {
            processCommandFiles(value, /* makeRelative */ false, /* separateUnit */ false);
            return "";
        },
        "One or more command files containing additional program options. "
        "Paths in the file are considered relative to the current directory.",
        "<file-pattern>[,...]", CommandLineFlags::CommaList);

    cmdLine.add(
        "-F",
        [this](std::string_view value) {
            processCommandFiles(value, /* makeRelative */ true, /* separateUnit */ false);
            return "";
        },
        "One or more command files containing additional program options. "
        "Paths in the file are considered relative to the file itself.",
        "<file-pattern>[,...]", CommandLineFlags::CommaList);

    // Analysis modifiers
    cmdLine.add("--dfa-unique-priority", options.dfaUniquePriority,
                "Respect the 'unique' and 'priority' keywords when analyzing data flow "
                "through case statements");

    cmdLine.add("--dfa-four-state", options.dfaFourState,
                "Require that case items cover X and Z bits to assume full coverage "
                "in data flow analysis");

    cmdLine.add("--max-case-analysis-steps", options.maxCaseAnalysisSteps,
                "Maximum number of steps that can occur during case analysis before giving up",
                "<steps>");
}